

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_verify(secp256k1_ge *a)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  uint64_t uVar102;
  uint64_t uVar103;
  uint64_t uVar104;
  uint64_t uVar105;
  int iVar106;
  int iVar107;
  secp256k1_gej *psVar108;
  secp256k1_gej *a_00;
  secp256k1_fe *a_01;
  ulong uVar109;
  undefined8 unaff_RBP;
  secp256k1_gej *psVar110;
  ulong uVar111;
  secp256k1_gej *psVar112;
  ulong uVar113;
  secp256k1_gej *r;
  secp256k1_gej *psVar114;
  ulong uVar115;
  ulong uVar116;
  undefined8 unaff_R12;
  ulong uVar117;
  ulong unaff_R13;
  
  auVar95._8_8_ = unaff_R12;
  auVar95._0_8_ = unaff_RBP;
  secp256k1_fe_verify(&a->x);
  r = (secp256k1_gej *)&a->y;
  secp256k1_fe_verify((secp256k1_fe *)r);
  secp256k1_fe_verify_magnitude(&a->x,4);
  psVar110 = (secp256k1_gej *)0x3;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)r,3);
  if ((uint)a->infinity < 2) {
    return;
  }
  secp256k1_ge_verify_cold_1();
  if ((r->x).magnitude <= (int)psVar110) {
    return;
  }
  secp256k1_fe_verify_magnitude_cold_1();
  secp256k1_fe_verify(&psVar110->x);
  uVar111 = 8;
  psVar114 = psVar110;
  secp256k1_fe_verify_magnitude(&psVar110->x,8);
  uVar116 = (psVar110->x).n[0];
  if (uVar116 >> 0x38 == 0) {
    psVar114 = (secp256k1_gej *)(psVar110->x).n[1];
    if ((secp256k1_gej *)0xffffffffffffff < psVar114) goto LAB_00114b9e;
    uVar109 = (psVar110->x).n[2];
    if (0xffffffffffffff < uVar109) goto LAB_00114ba3;
    uVar113 = (psVar110->x).n[3];
    if (0xffffffffffffff < uVar113) goto LAB_00114ba8;
    uVar115 = (psVar110->x).n[4];
    if (uVar115 >> 0x34 != 0) goto LAB_00114bad;
    uVar1 = uVar116 * 2;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar113;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar1;
    uVar111 = (long)psVar114 * 2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar109;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar111;
    auVar95 = auVar4 * auVar56 + auVar3 * auVar55;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar115;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = uVar115;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = SUB168(auVar5 * auVar57,0);
    auVar3 = auVar95 + auVar6 * ZEXT816(0x1000003d10);
    unaff_R13 = auVar3._8_8_;
    if (unaff_R13 >> 0x33 != 0) goto LAB_00114bb2;
    auVar100 = auVar3 >> 0x34;
    psVar110 = auVar100._0_8_;
    uVar115 = uVar115 * 2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar115;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar116;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar113;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar111;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar109;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar109;
    auVar95 = auVar7 * auVar58 + auVar9 * auVar60 + auVar8 * auVar59;
    uVar117 = SUB168(auVar95 + (auVar3 >> 0x34),8);
    if (0x7ffffffffffff < uVar117) goto LAB_00114bb7;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SUB168(auVar5 * auVar57,8);
    auVar95 = auVar10 * ZEXT816(0x1000003d10000) + auVar95 + (auVar3 >> 0x34);
    auVar101 = auVar95 >> 0x34;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar115;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = psVar114;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar113;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar109 * 2;
    auVar4 = auVar12 * auVar62 + auVar11 * auVar61 + (auVar95 >> 0x34);
    if (auVar4._8_8_ >> 0x32 != 0) goto LAB_00114bbc;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar116;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar116;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar95._6_2_ & 0xf);
    auVar5 = auVar14 * ZEXT816(0x1000003d1) + auVar13 * auVar63;
    psVar110 = (secp256k1_gej *)(auVar5._0_8_ & 0xfffffffffffff);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar115;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar109;
    (r->x).n[0] = (uint64_t)psVar110;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar113;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar113;
    psVar112 = (secp256k1_gej *)0x3ffffffffffff;
    auVar4 = auVar16 * auVar65 + auVar15 * auVar64 + (auVar4 >> 0x34);
    if (0x3ffffffffffff < auVar4._8_8_) goto LAB_00114bc1;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = psVar114;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar1;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
    auVar5 = auVar18 * ZEXT816(0x1000003d10) + auVar17 * auVar66 + (auVar5 >> 0x34);
    psVar110 = psVar114;
    if (0x7ffffffffffff < auVar5._8_8_) goto LAB_00114bc6;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar109;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar1;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = psVar114;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = psVar114;
    auVar6 = auVar20 * auVar68 + auVar19 * auVar67;
    uVar116 = SUB168(auVar6 + (auVar5 >> 0x34),8);
    (r->x).n[1] = auVar5._0_8_ & 0xfffffffffffff;
    psVar112 = (secp256k1_gej *)(0x3ffffffffffff - uVar116);
    if (0x3ffffffffffff < uVar116) goto LAB_00114bcb;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar115;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar113;
    auVar4 = auVar21 * auVar69 + (auVar4 >> 0x34);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auVar4._0_8_;
    auVar5 = auVar22 * ZEXT816(0x1000003d10) + auVar6 + (auVar5 >> 0x34);
    (r->x).n[2] = auVar5._0_8_ & 0xfffffffffffff;
    auVar5 = auVar5 >> 0x34;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = auVar5._0_8_;
    psVar112 = auVar5._8_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar4._8_8_;
    auVar96._8_8_ = psVar112;
    auVar96._0_8_ = auVar3._0_8_ & 0xffffffffffffe;
    auVar97 = auVar23 * ZEXT816(0x1000003d10000) + auVar96 + auVar97;
    uVar116 = auVar97._0_8_;
    uVar111 = auVar97._8_8_;
    if (uVar111 >> 0x24 != 0) goto LAB_00114bd0;
    (r->x).n[3] = uVar116 & 0xfffffffffffff;
    uVar116 = (uVar111 << 0xc | uVar116 >> 0x34) + (auVar95._0_8_ & 0xffffffffffff);
    (r->x).n[4] = uVar116;
    if (uVar116 >> 0x31 == 0) {
      (r->x).magnitude = 1;
      (r->x).normalized = 0;
      secp256k1_fe_verify(&r->x);
      return;
    }
  }
  else {
    secp256k1_fe_sqr_cold_13();
LAB_00114b9e:
    secp256k1_fe_sqr_cold_12();
LAB_00114ba3:
    secp256k1_fe_sqr_cold_11();
LAB_00114ba8:
    secp256k1_fe_sqr_cold_10();
LAB_00114bad:
    secp256k1_fe_sqr_cold_9();
LAB_00114bb2:
    uVar117 = auVar95._8_8_;
    secp256k1_fe_sqr_cold_8();
    auVar100._8_8_ = unaff_R13;
    auVar100._0_8_ = psVar114;
LAB_00114bb7:
    psVar110 = auVar100._0_8_;
    secp256k1_fe_sqr_cold_7();
    auVar101._8_8_ = uVar111;
    auVar101._0_8_ = uVar117;
LAB_00114bbc:
    psVar112 = auVar101._8_8_;
    secp256k1_fe_sqr_cold_6();
LAB_00114bc1:
    secp256k1_fe_sqr_cold_5();
LAB_00114bc6:
    r = psVar110;
    secp256k1_fe_sqr_cold_4();
LAB_00114bcb:
    secp256k1_fe_sqr_cold_3();
LAB_00114bd0:
    secp256k1_fe_sqr_cold_2();
  }
  secp256k1_fe_sqr_cold_1();
  secp256k1_fe_verify(&psVar112->x);
  secp256k1_fe_verify(&a_00->x);
  secp256k1_fe_verify_magnitude(&psVar112->x,8);
  psVar110 = (secp256k1_gej *)0x8;
  psVar114 = a_00;
  secp256k1_fe_verify_magnitude(&a_00->x,8);
  if (r == a_00) {
    secp256k1_fe_mul_cold_21();
LAB_00115115:
    secp256k1_fe_mul_cold_20();
LAB_0011511a:
    secp256k1_fe_mul_cold_19();
LAB_0011511f:
    secp256k1_fe_mul_cold_18();
LAB_00115124:
    secp256k1_fe_mul_cold_17();
LAB_00115129:
    secp256k1_fe_mul_cold_16();
LAB_0011512e:
    secp256k1_fe_mul_cold_15();
LAB_00115133:
    secp256k1_fe_mul_cold_14();
LAB_00115138:
    secp256k1_fe_mul_cold_13();
LAB_0011513d:
    secp256k1_fe_mul_cold_12();
LAB_00115142:
    secp256k1_fe_mul_cold_11();
    psVar112 = psVar110;
    psVar108 = psVar114;
LAB_00115147:
    secp256k1_fe_mul_cold_10();
LAB_0011514c:
    secp256k1_fe_mul_cold_9();
LAB_00115151:
    secp256k1_fe_mul_cold_8();
LAB_00115156:
    r = psVar108;
    secp256k1_fe_mul_cold_7();
LAB_0011515b:
    secp256k1_fe_mul_cold_6();
LAB_00115160:
    secp256k1_fe_mul_cold_5();
LAB_00115165:
    secp256k1_fe_mul_cold_4();
LAB_0011516a:
    secp256k1_fe_mul_cold_3();
  }
  else {
    if (psVar112 == a_00) goto LAB_00115115;
    uVar116 = (psVar112->x).n[0];
    if (uVar116 >> 0x38 != 0) goto LAB_0011511a;
    uVar111 = (psVar112->x).n[1];
    if (0xffffffffffffff < uVar111) goto LAB_0011511f;
    psVar110 = (secp256k1_gej *)(psVar112->x).n[2];
    if ((secp256k1_gej *)0xffffffffffffff < psVar110) goto LAB_00115124;
    uVar109 = (psVar112->x).n[3];
    if (0xffffffffffffff < uVar109) goto LAB_00115129;
    uVar113 = (psVar112->x).n[4];
    if (uVar113 >> 0x34 != 0) goto LAB_0011512e;
    uVar115 = (a_00->x).n[0];
    if (0xffffffffffffff < uVar115) goto LAB_00115133;
    uVar1 = (a_00->x).n[1];
    if (0xffffffffffffff < uVar1) goto LAB_00115138;
    uVar117 = (a_00->x).n[2];
    if (0xffffffffffffff < uVar117) goto LAB_0011513d;
    psVar114 = (secp256k1_gej *)(a_00->x).n[3];
    if ((secp256k1_gej *)0xffffffffffffff < psVar114) goto LAB_00115142;
    uVar2 = (a_00->x).n[4];
    psVar112 = psVar110;
    psVar108 = psVar114;
    if (0xfffffffffffff < uVar2) goto LAB_00115147;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = psVar114;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar116;
    psVar108 = SUB168(auVar24 * auVar70,0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar117;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar111;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar1;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = psVar110;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar115;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar109;
    auVar95 = auVar24 * auVar70 + auVar25 * auVar71 + auVar27 * auVar73 + auVar26 * auVar72;
    psVar112 = auVar95._8_8_;
    if ((ulong)psVar112 >> 0x32 != 0) goto LAB_0011514c;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar2;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar113;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = SUB168(auVar28 * auVar74,0);
    auVar95 = auVar95 + auVar29 * ZEXT816(0x1000003d10);
    auVar4 = auVar95 >> 0x34;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar2;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar116;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = psVar114;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar111;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar117;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = psVar110;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar1;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar109;
    psVar108 = SUB168(auVar33 * auVar78,8);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar115;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar113;
    auVar3 = auVar31 * auVar76 + auVar32 * auVar77 + auVar34 * auVar79 + auVar33 * auVar78;
    auVar5 = auVar30 * auVar75 + auVar3;
    psVar112 = (secp256k1_gej *)
               (auVar5._8_8_ + auVar4._8_8_ + (ulong)CARRY8(auVar5._0_8_,auVar4._0_8_));
    if ((ulong)psVar112 >> 0x33 != 0) goto LAB_00115151;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = SUB168(auVar28 * auVar74,8);
    auVar3 = auVar35 * ZEXT816(0x1000003d10000) + auVar4 + auVar3 + auVar30 * auVar75;
    psVar112 = SUB168(auVar3 >> 0x34,0);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar2;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar111;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = psVar114;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = psVar110;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar117;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar109;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar1;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar113;
    auVar4 = (auVar3 >> 0x34) +
             auVar37 * auVar81 + auVar39 * auVar83 + auVar38 * auVar82 + auVar36 * auVar80;
    psVar108 = SUB168(auVar37 * auVar81,0);
    if (0x3ffffffffffff < auVar4._8_8_) goto LAB_00115156;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar115;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar116;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = auVar4._0_8_ * 0x10 & 0xfffffffffffff0U | (ulong)(auVar3._6_2_ & 0xf);
    auVar5 = auVar40 * auVar84 + auVar41 * ZEXT816(0x1000003d1);
    (r->x).n[0] = auVar5._0_8_ & 0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar116;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = (a_00->x).n[1];
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar111;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = (a_00->x).n[0];
    auVar5 = auVar42 * auVar85 + (auVar5 >> 0x34) + auVar43 * auVar86;
    psVar112 = auVar5._8_8_;
    if ((secp256k1_gej *)0x3ffffffffffff < psVar112) goto LAB_0011515b;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = psVar110;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = (a_00->x).n[4];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar109;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = (a_00->x).n[3];
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar113;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = (a_00->x).n[2];
    auVar4 = auVar44 * auVar87 + (auVar4 >> 0x34) + auVar45 * auVar88 + auVar46 * auVar89;
    if (0x3ffffffffffff < auVar4._8_8_) goto LAB_00115160;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
    auVar5 = auVar5 + auVar47 * ZEXT816(0x1000003d10);
    (r->x).n[1] = auVar5._0_8_ & 0xfffffffffffff;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar116;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = (a_00->x).n[2];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar111;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = (a_00->x).n[1];
    auVar50._8_8_ = 0;
    auVar50._0_8_ = psVar110;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = (a_00->x).n[0];
    auVar5 = auVar49 * auVar91 + auVar48 * auVar90 + (auVar5 >> 0x34) + auVar50 * auVar92;
    psVar112 = auVar5._8_8_;
    if ((secp256k1_gej *)0x3ffffffffffff < psVar112) goto LAB_00115165;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar109;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = (a_00->x).n[4];
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar113;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = (a_00->x).n[3];
    auVar4 = auVar51 * auVar93 + (auVar4 >> 0x34) + auVar52 * auVar94;
    uVar116 = auVar4._8_8_;
    if (0x3ffffffffffff < uVar116) goto LAB_0011516a;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = auVar4._0_8_;
    auVar5 = auVar5 + auVar53 * ZEXT816(0x1000003d10);
    auVar4 = auVar5 >> 0x34;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = auVar4._0_8_;
    (r->x).n[2] = auVar5._0_8_ & 0xfffffffffffff;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar116;
    psVar112 = auVar4._8_8_;
    auVar98._8_8_ = psVar112;
    auVar98._0_8_ = auVar95._0_8_ & 0xfffffffffffff;
    auVar99 = auVar54 * ZEXT816(0x1000003d10000) + auVar98 + auVar99;
    uVar116 = auVar99._0_8_;
    uVar111 = auVar99._8_8_;
    if (uVar111 >> 0x24 == 0) {
      (r->x).n[3] = uVar116 & 0xfffffffffffff;
      uVar116 = (uVar111 << 0xc | uVar116 >> 0x34) + (auVar3._0_8_ & 0xffffffffffff);
      (r->x).n[4] = uVar116;
      if (uVar116 >> 0x31 == 0) {
        (r->x).magnitude = 1;
        (r->x).normalized = 0;
        secp256k1_fe_verify(&r->x);
        return;
      }
      goto LAB_00115174;
    }
  }
  secp256k1_fe_mul_cold_2();
LAB_00115174:
  secp256k1_fe_mul_cold_1();
  secp256k1_gej_verify(psVar112);
  if (psVar112->infinity == 0) {
    if (a_01 != (secp256k1_fe *)0x0) {
      uVar102 = (psVar112->y).n[0];
      uVar103 = (psVar112->y).n[1];
      uVar104 = (psVar112->y).n[2];
      uVar105 = (psVar112->y).n[3];
      iVar106 = (psVar112->y).magnitude;
      iVar107 = (psVar112->y).normalized;
      a_01->n[4] = (psVar112->y).n[4];
      a_01->magnitude = iVar106;
      a_01->normalized = iVar107;
      a_01->n[2] = uVar104;
      a_01->n[3] = uVar105;
      a_01->n[0] = uVar102;
      a_01->n[1] = uVar103;
      secp256k1_fe_verify(a_01);
      uVar116 = a_01->n[4];
      uVar109 = (uVar116 >> 0x30) * 0x1000003d1 + a_01->n[0];
      uVar111 = (uVar109 >> 0x34) + a_01->n[1];
      uVar113 = (uVar111 >> 0x34) + a_01->n[2];
      uVar115 = (uVar113 >> 0x34) + a_01->n[3];
      a_01->n[0] = uVar109 & 0xfffffffffffff;
      a_01->n[1] = uVar111 & 0xfffffffffffff;
      a_01->n[2] = uVar113 & 0xfffffffffffff;
      a_01->n[3] = uVar115 & 0xfffffffffffff;
      a_01->n[4] = (uVar115 >> 0x34) + (uVar116 & 0xffffffffffff);
      a_01->magnitude = 1;
      secp256k1_fe_verify(a_01);
    }
    secp256k1_gej_double(r,psVar112);
    secp256k1_gej_verify(r);
    return;
  }
  secp256k1_gej_set_infinity(r);
  if (a_01 != (secp256k1_fe *)0x0) {
    a_01->n[0] = 1;
    a_01->n[1] = 0;
    a_01->n[2] = 0;
    a_01->n[3] = 0;
    a_01->n[4] = 0;
    a_01->magnitude = 1;
    a_01->normalized = 1;
    secp256k1_fe_verify(a_01);
    return;
  }
  return;
}

Assistant:

static void secp256k1_ge_verify(const secp256k1_ge *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GE_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GE_Y_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}